

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isUnpackedArray(Type *this)

{
  Type *pTVar1;
  
  pTVar1 = getCanonicalType(this);
  return ((pTVar1->super_Symbol).kind & ~DeferredMember) == FixedSizeUnpackedArrayType;
}

Assistant:

bool Type::isUnpackedArray() const {
    switch (getCanonicalType().kind) {
        case SymbolKind::FixedSizeUnpackedArrayType:
        case SymbolKind::DynamicArrayType:
        case SymbolKind::AssociativeArrayType:
        case SymbolKind::QueueType:
            return true;
        default:
            return false;
    }
}